

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::EquidistantDistortion::EquidistantDistortion
          (EquidistantDistortion *this,Properties *prop,int id)

{
  Distortion *in_RDI;
  char *in_stack_000000d8;
  char *in_stack_00000188;
  double *in_stack_00000190;
  char *in_stack_00000198;
  Properties *in_stack_000001a0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__EquidistantDistortion_001f9b28;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000d8,this._4_4_);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000d8,this._4_4_);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000d8,this._4_4_);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000d8,this._4_4_);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

EquidistantDistortion::EquidistantDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("e1", id).c_str(), ed[0], "0");
  prop.getValue(getCameraKey("e2", id).c_str(), ed[1], "0");
  prop.getValue(getCameraKey("e3", id).c_str(), ed[2], "0");
  prop.getValue(getCameraKey("e4", id).c_str(), ed[3], "0");
}